

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * QByteArray::number(uint n,int base)

{
  QByteArray *in_RDI;
  QByteArray *s;
  QByteArray *this;
  
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QByteArray((QByteArray *)0x4b9553);
  setNum(this,(uint)((ulong)in_RDI >> 0x20),(int)in_RDI);
  return in_RDI;
}

Assistant:

QByteArray QByteArray::number(uint n, int base)
{
    QByteArray s;
    s.setNum(n, base);
    return s;
}